

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpserver.cpp
# Opt level: O0

void __thiscall uv::TCPServer::closeinl(TCPServer *this)

{
  bool bVar1;
  pointer ppVar2;
  CStringStream *pCVar3;
  ILog4zManager *pIVar4;
  long *in_FS_OFFSET;
  undefined1 local_40 [8];
  CStringStream ss;
  AcceptClient *data;
  _Self local_18;
  iterator it;
  TCPServer *this_local;
  
  if ((this->isclosed_ & 1U) == 0) {
    it._M_node = (_Base_ptr)this;
    uv_mutex_lock(&this->mutex_clients_);
    local_18._M_node =
         (_Base_ptr)
         std::
         map<int,_uv::AcceptClient_*,_std::less<int>,_std::allocator<std::pair<const_int,_uv::AcceptClient_*>_>_>
         ::begin(&this->clients_list_);
    while( true ) {
      data = (AcceptClient *)
             std::
             map<int,_uv::AcceptClient_*,_std::less<int>,_std::allocator<std::pair<const_int,_uv::AcceptClient_*>_>_>
             ::end(&this->clients_list_);
      bVar1 = std::operator!=(&local_18,(_Self *)&data);
      if (!bVar1) break;
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_uv::AcceptClient_*>_>::operator->
                         (&local_18);
      ss.m_pCur = (char *)ppVar2->second;
      AcceptClient::Close((AcceptClient *)ss.m_pCur);
      std::_Rb_tree_iterator<std::pair<const_int,_uv::AcceptClient_*>_>::operator++(&local_18);
    }
    uv_mutex_unlock(&this->mutex_clients_);
    uv_walk(&this->loop_,CloseWalkCB);
    zsummer::log4z::CStringStream::CStringStream
              ((CStringStream *)local_40,(char *)(*in_FS_OFFSET + -0x800),0x800);
    zsummer::log4z::CStringStream::operator<<((CStringStream *)local_40,"close server");
    pCVar3 = zsummer::log4z::CStringStream::operator<<((CStringStream *)local_40," ( ");
    pCVar3 = zsummer::log4z::CStringStream::operator<<(pCVar3," ");
    pCVar3 = zsummer::log4z::CStringStream::operator<<(pCVar3," ) : ");
    zsummer::log4z::CStringStream::operator<<(pCVar3,0x5c);
    pIVar4 = zsummer::log4z::ILog4zManager::GetInstance();
    (*pIVar4->_vptr_ILog4zManager[8])(pIVar4,0,1,*in_FS_OFFSET + -0x800);
  }
  return;
}

Assistant:

void TCPServer::closeinl()
{
    if (isclosed_) {
        return;
    }

    uv_mutex_lock(&mutex_clients_);
    for (auto it = clients_list_.begin(); it != clients_list_.end(); ++it) {
        auto data = it->second;
        data->Close();
    }
    uv_mutex_unlock(&mutex_clients_);
    uv_walk(&loop_, CloseWalkCB, this);//close all handle in loop
    LOGI("close server");
}